

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::setupDomainPropagation(HighsMipSolverData *this)

{
  reference pvVar1;
  double *pdVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RDI;
  pointer *this_00;
  HighsInt j;
  HighsInt end;
  HighsInt start;
  double maxabsval;
  HighsInt i;
  HighsLp *model;
  HighsPseudocost *pHVar4;
  HighsDomain *this_01;
  size_type in_stack_fffffffffffffb08;
  double dVar5;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb60;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb70;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffb78;
  HighsInt in_stack_fffffffffffffb80;
  HighsInt in_stack_fffffffffffffb84;
  HighsDomain *in_stack_fffffffffffffb88;
  HighsDomain *in_stack_fffffffffffffb90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb98;
  HighsMipSolver *in_stack_fffffffffffffc08;
  HighsDomain *in_stack_fffffffffffffc10;
  HighsMipSolver *in_stack_fffffffffffffcf8;
  HighsPseudocost *in_stack_fffffffffffffd00;
  double local_1a0;
  value_type local_194;
  int local_190;
  value_type local_18c;
  double local_188;
  int local_17c;
  double local_10;
  
  local_10 = (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[2];
  pHVar4 = (HighsPseudocost *)
           &in_RDI[0x42d].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  this_01 = (HighsDomain *)
            &in_RDI[0x42e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  highsSparseTranspose
            (in_stack_fffffffffffffb84,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
             in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffb90,
             in_stack_fffffffffffffb98);
  HighsPseudocost::HighsPseudocost(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  HighsPseudocost::operator=((HighsPseudocost *)this_01,pHVar4);
  HighsPseudocost::~HighsPseudocost((HighsPseudocost *)this_01);
  std::vector<double,_std::allocator<double>_>::resize(in_RDI,in_stack_fffffffffffffb08);
  for (local_17c = 0;
      local_17c !=
      *(int *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start[2] + 4); local_17c = local_17c + 1) {
    local_188 = 0.0;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x42c].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_17c);
    local_18c = *pvVar1;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &in_RDI[0x42c].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)(local_17c + 1));
    local_190 = *pvVar1;
    for (local_194 = local_18c; local_194 != local_190; local_194 = local_194 + 1) {
      this_00 = &in_RDI[0x42e].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)this_00,(long)local_194);
      std::abs((int)this_00);
      pdVar2 = std::max<double>(&local_188,&local_1a0);
      local_188 = *pdVar2;
    }
    dVar5 = local_188;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[0x42f].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)local_17c);
    *pvVar3 = dVar5;
  }
  HighsDomain::HighsDomain(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  HighsDomain::operator=(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  HighsDomain::~HighsDomain(this_01);
  HighsDomain::computeRowActivities
            ((HighsDomain *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  return;
}

Assistant:

void HighsMipSolverData::setupDomainPropagation() {
  const HighsLp& model = *mipsolver.model_;
  highsSparseTranspose(model.num_row_, model.num_col_, model.a_matrix_.start_,
                       model.a_matrix_.index_, model.a_matrix_.value_, ARstart_,
                       ARindex_, ARvalue_);

  pseudocost = HighsPseudocost(mipsolver);

  // compute the maximal absolute coefficients to filter propagation
  maxAbsRowCoef.resize(mipsolver.model_->num_row_);
  for (HighsInt i = 0; i != mipsolver.model_->num_row_; ++i) {
    double maxabsval = 0.0;

    HighsInt start = ARstart_[i];
    HighsInt end = ARstart_[i + 1];
    for (HighsInt j = start; j != end; ++j)
      maxabsval = std::max(maxabsval, std::abs(ARvalue_[j]));

    maxAbsRowCoef[i] = maxabsval;
  }

  domain = HighsDomain(mipsolver);
  domain.computeRowActivities();
}